

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetChannelMask
          (Error *__return_storage_ptr__,CommissionerApp *this,ChannelMask *aChannelMask)

{
  ChannelMask *aChannelMask_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetChannelMask(const ChannelMask &aChannelMask)
{
    UNUSED(aChannelMask);
    return Error{};
}